

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Tracks::Parse(Tracks *this)

{
  undefined1 auVar1 [16];
  long lVar2;
  ulong uVar3;
  void *pvVar4;
  longlong *plVar5;
  long in_RDI;
  long status_2;
  Track **pTrack;
  longlong element_size;
  longlong payload_stop;
  long status_1;
  longlong payload_size;
  longlong id_1;
  longlong element_start;
  long status;
  longlong size;
  longlong id;
  longlong pos;
  longlong count;
  IMkvReader *pReader;
  longlong stop;
  Track **in_stack_000001a0;
  longlong in_stack_000001a8;
  longlong in_stack_000001b0;
  longlong in_stack_000001b8;
  longlong in_stack_000001c0;
  Tracks *in_stack_000001c8;
  longlong *in_stack_ffffffffffffff78;
  long *in_stack_ffffffffffffff80;
  long in_stack_ffffffffffffff88;
  longlong *in_stack_ffffffffffffff90;
  IMkvReader *in_stack_ffffffffffffff98;
  long local_60;
  long local_58;
  long local_40;
  long local_38;
  longlong *local_30;
  ulong local_28;
  
  plVar5 = (longlong *)(*(long *)(in_RDI + 8) + *(long *)(in_RDI + 0x10));
  local_28 = 0;
  local_30 = *(longlong **)(in_RDI + 8);
  while ((long)local_30 < (long)plVar5) {
    lVar2 = ParseElementHeader(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                               in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                               in_stack_ffffffffffffff78);
    if (lVar2 < 0) {
      return lVar2;
    }
    if (local_40 != 0) {
      if ((local_38 == 0xae) && (local_28 = local_28 + 1, 0x7fffffff < (long)local_28)) {
        return -1;
      }
      local_30 = (longlong *)(local_40 + (long)local_30);
      if ((long)plVar5 < (long)local_30) {
        return -2;
      }
    }
  }
  if (local_30 != plVar5) {
    return -2;
  }
  if (0 < (long)local_28) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_28;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3,(nothrow_t *)&std::nothrow);
    *(void **)(in_RDI + 0x28) = pvVar4;
    if (*(long *)(in_RDI + 0x28) == 0) {
      return -1;
    }
    *(undefined8 *)(in_RDI + 0x30) = *(undefined8 *)(in_RDI + 0x28);
    local_30 = *(longlong **)(in_RDI + 8);
    do {
      do {
        if ((long)plVar5 <= (long)local_30) {
          if (local_30 != plVar5) {
            return -2;
          }
          return 0;
        }
        in_stack_ffffffffffffff98 =
             (IMkvReader *)
             ParseElementHeader(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                                in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                in_stack_ffffffffffffff78);
        if ((long)in_stack_ffffffffffffff98 < 0) {
          return (long)in_stack_ffffffffffffff98;
        }
      } while (local_60 == 0);
      in_stack_ffffffffffffff90 = (longlong *)((long)local_30 + local_60);
      in_stack_ffffffffffffff88 = (long)in_stack_ffffffffffffff90 - (long)local_30;
      if (local_58 == 0xae) {
        in_stack_ffffffffffffff80 = *(long **)(in_RDI + 0x30);
        *in_stack_ffffffffffffff80 = 0;
        lVar2 = ParseTrackEntry(in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,
                                in_stack_000001b0,in_stack_000001a8,in_stack_000001a0);
        if (lVar2 != 0) {
          return lVar2;
        }
        if (*in_stack_ffffffffffffff80 != 0) {
          *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 8;
        }
        in_stack_ffffffffffffff78 = (longlong *)0x0;
      }
      local_30 = in_stack_ffffffffffffff90;
    } while ((long)in_stack_ffffffffffffff90 <= (long)plVar5);
    return -2;
  }
  return 0;
}

Assistant:

long Tracks::Parse() {
  assert(m_trackEntries == NULL);
  assert(m_trackEntriesEnd == NULL);

  const long long stop = m_start + m_size;
  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long count = 0;
  long long pos = m_start;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)  // weird
      continue;

    if (id == libwebm::kMkvTrackEntry) {
      ++count;
      if (count > INT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  if (count <= 0)
    return 0;  // success

  m_trackEntries = new (std::nothrow) Track*[static_cast<size_t>(count)];

  if (m_trackEntries == NULL)
    return -1;

  m_trackEntriesEnd = m_trackEntries;

  pos = m_start;

  while (pos < stop) {
    const long long element_start = pos;

    long long id, payload_size;

    const long status =
        ParseElementHeader(pReader, pos, stop, id, payload_size);

    if (status < 0)  // error
      return status;

    if (payload_size == 0)  // weird
      continue;

    const long long payload_stop = pos + payload_size;
    assert(payload_stop <= stop);  // checked in ParseElement

    const long long element_size = payload_stop - element_start;

    if (id == libwebm::kMkvTrackEntry) {
      Track*& pTrack = *m_trackEntriesEnd;
      pTrack = NULL;

      const long status = ParseTrackEntry(pos, payload_size, element_start,
                                          element_size, pTrack);
      if (status)
        return status;

      if (pTrack)
        ++m_trackEntriesEnd;
    }

    pos = payload_stop;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  return 0;  // success
}